

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDF::makeIndirectObject(QPDF *this,QPDFObjectHandle *oh)

{
  bool bVar1;
  logic_error *this_00;
  BaseHandle *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar2;
  QPDFObjectHandle local_40 [2];
  QPDFObjectHandle *oh_local;
  QPDF *this_local;
  
  oh_local = oh;
  this_local = this;
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool(in_RDX);
  if (!bVar1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"attempted to make an uninitialized QPDFObjectHandle indirect");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  QPDFObjectHandle::getObj(local_40);
  makeIndirectFromQPDFObject(this,(shared_ptr<QPDFObject> *)oh);
  std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)local_40);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::makeIndirectObject(QPDFObjectHandle oh)
{
    if (!oh) {
        throw std::logic_error("attempted to make an uninitialized QPDFObjectHandle indirect");
    }
    return makeIndirectFromQPDFObject(oh.getObj());
}